

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall icu_63::Calendar::clear(Calendar *this)

{
  UBool *pUVar1;
  long lVar2;
  
  for (lVar2 = -0x17; lVar2 != 0; lVar2 = lVar2 + 1) {
    pUVar1 = this->fIsSet + lVar2 * 4;
    pUVar1[0] = '\0';
    pUVar1[1] = '\0';
    pUVar1[2] = '\0';
    pUVar1[3] = '\0';
    this->fStamp[lVar2 + 0x17] = 0;
    *(undefined1 *)((long)this->fStamp + lVar2 + -1) = 0;
  }
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  return;
}

Assistant:

void
Calendar::clear()
{
    for (int32_t i=0; i<UCAL_FIELD_COUNT; ++i) {
        fFields[i]     = 0; // Must do this; other code depends on it
        fStamp[i]     = kUnset;
        fIsSet[i]     = FALSE; // Remove later
    }
    fIsTimeSet = fAreFieldsSet = fAreAllFieldsSet = fAreFieldsVirtuallySet = FALSE;
    // fTime is not 'cleared' - may be used if no fields are set.
}